

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O1

void mpp_timer_set_callback(MppTimer timer,MppThreadFunc func,void *ctx)

{
  MPP_RET MVar1;
  
  if (timer != (MppTimer)0x0) {
    MVar1 = check_is_mpp_timer(timer);
    if (MVar1 == MPP_OK) {
      if (func != (MppThreadFunc)0x0) {
        *(MppThreadFunc *)((long)timer + 0x38) = func;
        *(void **)((long)timer + 0x40) = ctx;
        return;
      }
      _mpp_log_l(2,"mpp_time","invalid NULL callback\n","mpp_timer_set_callback");
      return;
    }
  }
  _mpp_log_l(2,"mpp_time","invalid timer %p\n","mpp_timer_set_callback",timer);
  return;
}

Assistant:

void mpp_timer_set_callback(MppTimer timer, MppThreadFunc func, void *ctx)
{
    if (NULL == timer || check_is_mpp_timer(timer)) {
        mpp_err_f("invalid timer %p\n", timer);
        return ;
    }

    if (NULL == func) {
        mpp_err_f("invalid NULL callback\n");
        return ;
    }

    MppTimerImpl *impl = (MppTimerImpl *)timer;
    impl->func = func;
    impl->ctx = ctx;
}